

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b8a13::CAPIBuildSystemFrontendDelegate::error
          (CAPIBuildSystemFrontendDelegate *this,StringRef filename,Token *at,Twine *message)

{
  _func_void_void_ptr_llb_buildsystem_diagnostic_kind_t_char_ptr_int_int_char_ptr *p_Var1;
  void *pvVar2;
  char *pcVar3;
  char *pcVar4;
  string local_70;
  string local_50;
  Twine *local_30;
  Twine *message_local;
  Token *at_local;
  CAPIBuildSystemFrontendDelegate *this_local;
  StringRef filename_local;
  
  filename_local.Data = (char *)filename.Length;
  this_local = (CAPIBuildSystemFrontendDelegate *)filename.Data;
  local_30 = message;
  message_local = (Twine *)at;
  at_local = (Token *)this;
  if ((this->cAPIDelegate).handle_diagnostic ==
      (_func_void_void_ptr_llb_buildsystem_diagnostic_kind_t_char_ptr_int_int_char_ptr *)0x0) {
    llbuild::buildsystem::BuildSystemFrontendDelegate::error
              (&this->super_BuildSystemFrontendDelegate,filename,at,message);
  }
  else {
    p_Var1 = (this->cAPIDelegate).handle_diagnostic;
    pvVar2 = (this->cAPIDelegate).context;
    llvm::StringRef::str_abi_cxx11_(&local_50,(StringRef *)&this_local);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    llvm::Twine::str_abi_cxx11_(&local_70,local_30);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    (*p_Var1)(pvVar2,llb_buildsystem_diagnostic_kind_error,pcVar3,-1,-1,pcVar4);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

virtual void error(StringRef filename, const Token& at, const Twine& message) override {
    if (cAPIDelegate.handle_diagnostic) {
      cAPIDelegate.handle_diagnostic(cAPIDelegate.context,
                                     llb_buildsystem_diagnostic_kind_error,
                                     filename.str().c_str(),
                                     -1,
                                     -1,
                                     message.str().c_str());
    } else {
        BuildSystemFrontendDelegate::error(filename, at, message);
    }
  }